

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

int64_t __thiscall fasttext::Args::getAutotuneModelSize(Args *this)

{
  size_type sVar1;
  mapped_type *pmVar2;
  long lVar3;
  invalid_argument *this_00;
  int64_t iVar4;
  long lVar5;
  char lastCharacter;
  undefined1 local_b1;
  size_t nonNumericCharacter;
  string modelSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  units;
  
  std::__cxx11::string::string((string *)&modelSize,(string *)&this->autotuneModelSize);
  if (modelSize._M_string_length == 0) {
    iVar4 = -1;
  }
  else {
    uStack_68 = 0x3b9aca0000000067;
    uStack_60 = 0x3b9aca0000000047;
    local_88._M_dataplus._M_p = (pointer)0x3e80000006b;
    local_88._M_string_length = 0x3e80000004b;
    local_88.field_2._M_allocated_capacity = 0xf42400000006d;
    local_88.field_2._8_8_ = 0xf42400000004d;
    std::
    _Hashtable<char,std::pair<char_const,int>,std::allocator<std::pair<char_const,int>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<char_const,int>const*>
              ((_Hashtable<char,std::pair<char_const,int>,std::allocator<std::pair<char_const,int>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&units,&local_88,local_58,0,&nonNumericCharacter,&lastCharacter,&local_b1);
    lastCharacter = modelSize._M_dataplus._M_p[modelSize._M_string_length - 1];
    sVar1 = std::
            _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&units._M_h,&lastCharacter);
    if (sVar1 == 0) {
      lVar5 = 1;
    }
    else {
      pmVar2 = std::__detail::
               _Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&units,&lastCharacter);
      lVar5 = (long)*pmVar2;
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&modelSize);
      std::__cxx11::string::operator=((string *)&modelSize,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    nonNumericCharacter = 0;
    lVar3 = std::__cxx11::stol(&modelSize,&nonNumericCharacter,10);
    if (nonNumericCharacter != modelSize._M_string_length) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_88,"Unable to parse model size ",&this->autotuneModelSize);
      std::invalid_argument::invalid_argument(this_00,(string *)&local_88);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar4 = lVar3 * lVar5;
    std::
    _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&units._M_h);
  }
  std::__cxx11::string::~string((string *)&modelSize);
  return iVar4;
}

Assistant:

int64_t Args::getAutotuneModelSize() const {
  std::string modelSize = autotuneModelSize;
  if (modelSize.empty()) {
    return Args::kUnlimitedModelSize;
  }
  std::unordered_map<char, int> units = {
      {'k', 1000},
      {'K', 1000},
      {'m', 1000000},
      {'M', 1000000},
      {'g', 1000000000},
      {'G', 1000000000},
  };
  uint64_t multiplier = 1;
  char lastCharacter = modelSize.back();
  if (units.count(lastCharacter)) {
    multiplier = units[lastCharacter];
    modelSize = modelSize.substr(0, modelSize.size() - 1);
  }
  uint64_t size = 0;
  size_t nonNumericCharacter = 0;
  bool parseError = false;
  try {
    size = std::stol(modelSize, &nonNumericCharacter);
  } catch (std::invalid_argument&) {
    parseError = true;
  }
  if (!parseError && nonNumericCharacter != modelSize.size()) {
    parseError = true;
  }
  if (parseError) {
    throw std::invalid_argument(
        "Unable to parse model size " + autotuneModelSize);
  }

  return size * multiplier;
}